

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxwell.cpp
# Opt level: O2

void __thiscall fdtd_solver::advance_e(fdtd_solver *this)

{
  double *pdVar1;
  double *pdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  field3d<celle> *pfVar11;
  field3d<cellb> *pfVar12;
  field3d<cellj> *pfVar13;
  cellb ***pppcVar14;
  cellb **ppcVar15;
  cellb *pcVar16;
  cellb *pcVar17;
  cellb *pcVar18;
  cellj *pcVar19;
  celle *pcVar20;
  undefined1 auVar21 [16];
  long lVar22;
  long lVar23;
  long lVar24;
  int i_2;
  int j_1;
  int i;
  long lVar25;
  int j;
  long lVar26;
  long lVar27;
  int k;
  long lVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  
  pfVar11 = (this->super_maxwell_solver).ce;
  lVar22 = (long)pfVar11->nx + -1;
  lVar23 = (long)pfVar11->ny + -1;
  lVar24 = (long)pfVar11->nz + -1;
  for (lVar25 = 1; lVar25 < lVar22; lVar25 = lVar25 + 1) {
    for (lVar26 = 1; lVar26 < lVar23; lVar26 = lVar26 + 1) {
      dVar3 = (this->super_maxwell_solver).dtdz;
      auVar44._8_8_ = 0;
      auVar44._0_8_ = dVar3;
      dVar4 = (this->super_maxwell_solver).dtdx;
      auVar29._8_8_ = 0;
      auVar29._0_8_ = dVar4;
      dVar5 = (this->super_maxwell_solver).dtdy;
      auVar48._8_8_ = 0;
      auVar48._0_8_ = dVar5;
      auVar7._0_8_ = (this->super_maxwell_solver).dx;
      auVar7._8_8_ = (this->super_maxwell_solver).dy;
      auVar36._8_8_ = 0;
      auVar36._0_8_ = (this->super_maxwell_solver).dz;
      pfVar12 = (this->super_maxwell_solver).cb;
      pfVar13 = (this->super_maxwell_solver).cj;
      lVar28 = 0x28;
      lVar27 = 1;
      auVar45._0_8_ = -dVar3;
      auVar45._8_8_ = 0x8000000000000000;
      auVar40._0_8_ = -dVar4;
      auVar40._8_8_ = 0x8000000000000000;
      auVar32 = vunpcklpd_avx(auVar48,auVar40);
      auVar35 = vunpcklpd_avx(auVar44,auVar45);
      while (lVar27 < lVar24) {
        pppcVar14 = (pfVar12->p)._M_t.
                    super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                    super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                    super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
        lVar27 = lVar27 + 1;
        ppcVar15 = pppcVar14[lVar25];
        pcVar16 = ppcVar15[lVar26 + -1];
        pcVar17 = ppcVar15[lVar26];
        pcVar18 = pppcVar14[lVar25 + -1][lVar26];
        pcVar19 = (pfVar13->p)._M_t.
                  super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                  super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar25][lVar26];
        pcVar20 = (pfVar11->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar25][lVar26];
        auVar49._8_8_ = 0;
        auVar49._0_8_ = *(ulong *)((long)&pcVar16->bx + lVar28);
        uVar6 = *(undefined8 *)((long)&pcVar17->bx + lVar28);
        auVar46._8_8_ = uVar6;
        auVar46._0_8_ = uVar6;
        auVar21 = vmovhpd_avx(auVar49,*(undefined8 *)((long)&pcVar18->bx + lVar28));
        auVar43 = vsubpd_avx(auVar46,auVar21);
        auVar21 = *(undefined1 (*) [16])((long)pcVar17 + lVar28 + -0x10);
        auVar39 = vsubpd_avx(auVar21,*(undefined1 (*) [16])((long)pcVar17 + lVar28 + -0x28));
        auVar51._0_8_ = auVar39._0_8_ * auVar35._0_8_;
        auVar51._8_8_ = auVar39._8_8_ * auVar35._8_8_;
        auVar39 = vshufpd_avx(auVar51,auVar51,1);
        auVar39 = vfmadd231pd_fma(auVar39,auVar32,auVar43);
        auVar39 = vfnmadd231pd_fma(auVar39,auVar7,
                                   *(undefined1 (*) [16])((long)pcVar19 + lVar28 + -0x10));
        pdVar1 = (double *)((long)pcVar20 + lVar28 + -0x10);
        dVar4 = pdVar1[1];
        dVar3 = *(double *)((long)pcVar17 + lVar28 + -8);
        pdVar2 = (double *)((long)pcVar20 + lVar28 + -0x10);
        *pdVar2 = auVar39._0_8_ + *pdVar1;
        pdVar2[1] = auVar39._8_8_ + dVar4;
        auVar47._8_8_ = 0;
        auVar47._0_8_ = dVar3 - *(double *)((long)pcVar18 + lVar28 + -8);
        auVar50._8_8_ = 0;
        auVar50._0_8_ = (auVar21._0_8_ - *(double *)((long)pcVar16 + lVar28 + -0x10)) * -dVar5;
        auVar21 = vfmadd231sd_fma(auVar50,auVar29,auVar47);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = *(ulong *)((long)&pcVar19->jx + lVar28);
        auVar21 = vfnmadd231sd_fma(auVar21,auVar36,auVar8);
        *(double *)((long)&pcVar20->ex + lVar28) =
             auVar21._0_8_ + *(double *)((long)&pcVar20->ex + lVar28);
        lVar28 = lVar28 + 0x18;
      }
    }
  }
  for (lVar25 = 1; lVar25 < lVar23; lVar25 = lVar25 + 1) {
    dVar3 = (this->super_maxwell_solver).dtdz;
    auVar30._8_8_ = 0;
    auVar30._0_8_ = (this->super_maxwell_solver).dtdy;
    auVar33._8_8_ = 0;
    auVar33._0_8_ = (this->super_maxwell_solver).dx;
    pfVar12 = (this->super_maxwell_solver).cb;
    pfVar13 = (this->super_maxwell_solver).cj;
    lVar26 = 0;
    lVar27 = 1;
    while (lVar27 < lVar24) {
      lVar27 = lVar27 + 1;
      ppcVar15 = *(pfVar12->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
      pcVar16 = ppcVar15[lVar25];
      auVar37._8_8_ = 0;
      auVar37._0_8_ =
           (*(double *)((long)&pcVar16[1].by + lVar26) - *(double *)((long)&pcVar16->by + lVar26)) *
           -dVar3;
      auVar41._8_8_ = 0;
      auVar41._0_8_ =
           *(double *)((long)&pcVar16[1].bz + lVar26) -
           *(double *)((long)&ppcVar15[lVar25 + -1][1].bz + lVar26);
      auVar32 = vfmadd231sd_fma(auVar37,auVar30,auVar41);
      auVar9._8_8_ = 0;
      auVar9._0_8_ = *(ulong *)((long)&(*(pfVar13->p)._M_t.
                                         super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>
                                         ._M_t.
                                         super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>
                                         .super__Head_base<0UL,_cellj_***,_false>._M_head_impl)
                                       [lVar25][1].jx + lVar26);
      auVar32 = vfnmadd231sd_fma(auVar32,auVar33,auVar9);
      pcVar20 = (*(pfVar11->p)._M_t.
                  super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                  super__Head_base<0UL,_celle_***,_false>._M_head_impl)[lVar25];
      *(double *)((long)&pcVar20[1].ex + lVar26) =
           auVar32._0_8_ + *(double *)((long)&pcVar20[1].ex + lVar26);
      lVar26 = lVar26 + 0x18;
    }
  }
  for (lVar25 = 1; lVar25 < lVar22; lVar25 = lVar25 + 1) {
    dVar3 = (this->super_maxwell_solver).dtdz;
    auVar34._8_8_ = 0;
    auVar34._0_8_ = (this->super_maxwell_solver).dy;
    pfVar12 = (this->super_maxwell_solver).cb;
    pfVar13 = (this->super_maxwell_solver).cj;
    lVar26 = 0;
    lVar27 = 1;
    auVar31._0_8_ = -(this->super_maxwell_solver).dtdx;
    auVar31._8_8_ = 0x8000000000000000;
    while (lVar27 < lVar24) {
      pppcVar14 = (pfVar12->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
      lVar27 = lVar27 + 1;
      pcVar16 = *pppcVar14[lVar25];
      auVar38._8_8_ = 0;
      auVar38._0_8_ =
           dVar3 * (*(double *)((long)&pcVar16[1].bx + lVar26) -
                   *(double *)((long)&pcVar16->bx + lVar26));
      auVar42._8_8_ = 0;
      auVar42._0_8_ =
           *(double *)((long)&pcVar16[1].bz + lVar26) -
           *(double *)((long)&(*pppcVar14[lVar25 + -1])[1].bz + lVar26);
      auVar32 = vfmadd231sd_fma(auVar38,auVar31,auVar42);
      auVar10._8_8_ = 0;
      auVar10._0_8_ =
           *(ulong *)((long)&(*(pfVar13->p)._M_t.
                               super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
                               super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar25])[1].jy +
                     lVar26);
      auVar32 = vfnmadd231sd_fma(auVar32,auVar34,auVar10);
      pcVar20 = *(pfVar11->p)._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>
                 ._M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                 super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar25];
      *(double *)((long)&pcVar20[1].ey + lVar26) =
           auVar32._0_8_ + *(double *)((long)&pcVar20[1].ey + lVar26);
      lVar26 = lVar26 + 0x18;
    }
  }
  for (lVar24 = 1; lVar24 < lVar22; lVar24 = lVar24 + 1) {
    dVar3 = (this->super_maxwell_solver).dtdy;
    auVar32._8_8_ = 0;
    auVar32._0_8_ = (this->super_maxwell_solver).dtdx;
    auVar35._8_8_ = 0;
    auVar35._0_8_ = (this->super_maxwell_solver).dz;
    pfVar12 = (this->super_maxwell_solver).cb;
    pfVar13 = (this->super_maxwell_solver).cj;
    for (lVar25 = 1; lVar25 < lVar23; lVar25 = lVar25 + 1) {
      pppcVar14 = (pfVar12->p)._M_t.
                  super___uniq_ptr_impl<cellb_**,_std::default_delete<cellb_**[]>_>._M_t.
                  super__Tuple_impl<0UL,_cellb_***,_std::default_delete<cellb_**[]>_>.
                  super__Head_base<0UL,_cellb_***,_false>._M_head_impl;
      ppcVar15 = pppcVar14[lVar24];
      pcVar16 = ppcVar15[lVar25];
      auVar39._8_8_ = 0;
      auVar39._0_8_ = (pcVar16->bx - ppcVar15[lVar25 + -1]->bx) * -dVar3;
      auVar43._8_8_ = 0;
      auVar43._0_8_ = pcVar16->by - pppcVar14[lVar24 + -1][lVar25]->by;
      auVar39 = vfmadd231sd_fma(auVar39,auVar32,auVar43);
      auVar21._8_8_ = 0;
      auVar21._0_8_ =
           (pfVar13->p)._M_t.super___uniq_ptr_impl<cellj_**,_std::default_delete<cellj_**[]>_>._M_t.
           super__Tuple_impl<0UL,_cellj_***,_std::default_delete<cellj_**[]>_>.
           super__Head_base<0UL,_cellj_***,_false>._M_head_impl[lVar24][lVar25]->jz;
      auVar21 = vfnmadd231sd_fma(auVar39,auVar35,auVar21);
      pcVar20 = (pfVar11->p)._M_t.super___uniq_ptr_impl<celle_**,_std::default_delete<celle_**[]>_>.
                _M_t.super__Tuple_impl<0UL,_celle_***,_std::default_delete<celle_**[]>_>.
                super__Head_base<0UL,_celle_***,_false>._M_head_impl[lVar24][lVar25];
      pcVar20->ez = auVar21._0_8_ + pcVar20->ez;
    }
  }
  return;
}

Assistant:

void fdtd_solver::advance_e()
{
    const int nx = ce.get_nx();
    const int ny = ce.get_ny();
    const int nz = ce.get_nz();

    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
    {int i=0;
        for(int j=1;j<ny-1;j++) {
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ex +=  dtdy*(cb[i][j][k].bz-cb[i][j-1][k].bz) - dtdz*(cb[i][j][k].by-cb[i][j][k-1].by) - cj[i][j][k].jx*dx;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        {int j=0;
            for(int k=1;k<nz-1;k++) {
                ce[i][j][k].ey += -dtdx*(cb[i][j][k].bz-cb[i-1][j][k].bz) + dtdz*(cb[i][j][k].bx-cb[i][j][k-1].bx) - cj[i][j][k].jy*dy;
            }
        }
    }
    for(int i=1;i<nx-1;i++) {
        for(int j=1;j<ny-1;j++) {
            {int k=0;
                ce[i][j][k].ez +=  dtdx*(cb[i][j][k].by-cb[i-1][j][k].by) - dtdy*(cb[i][j][k].bx-cb[i][j-1][k].bx) - cj[i][j][k].jz*dz;
            }
        }
    }
}